

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O3

uint nullcGetGlobalType(char *name)

{
  uint uVar1;
  void *pvVar2;
  long lVar3;
  
  if (NULLC::initialized == '\0') {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
  }
  else {
    pvVar2 = nullcGetVariableData((uint *)0x0);
    if (pvVar2 == (void *)0x0) {
      return 0;
    }
    if (name == (char *)0x0) {
      return 0;
    }
    if (NULLC::linker == 0) {
      return 0;
    }
    uVar1 = NULLC::GetStringHash(name);
    if ((ulong)*(uint *)(NULLC::linker + 0x23c) == 0) {
      return 0;
    }
    lVar3 = 0;
    do {
      if (*(uint *)(*(long *)(NULLC::linker + 0x230) + 4 + lVar3) == uVar1) {
        return *(uint *)(*(long *)(NULLC::linker + 0x230) + 8 + lVar3);
      }
      lVar3 = lVar3 + 0x10;
    } while ((ulong)*(uint *)(NULLC::linker + 0x23c) << 4 != lVar3);
  }
  return 0;
}

Assistant:

unsigned nullcGetGlobalType(const char* name)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(0);

	char* mem = (char*)nullcGetVariableData(NULL);
	if(!linker || !name || !mem)
		return 0;
	unsigned hash = GetStringHash(name);
	for(unsigned i = 0; i < linker->exVariables.size(); i++)
	{
		if(linker->exVariables[i].nameHash == hash)
			return linker->exVariables[i].type;
	}
	return 0;
}